

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall
spatial_region::fout_by_yzplane(spatial_region *this,ofstream *pfout,int i,openmode mode)

{
  bool bVar1;
  cellb ***pppcVar2;
  ostream *poVar3;
  int in_ECX;
  int in_EDX;
  field3d<cellb> *in_RSI;
  field3d<cellb> *in_RDI;
  ofstream *unaff_retaddr;
  int k;
  int j;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  openmode mode_00;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int iVar4;
  field3d<cellb> *pfVar5;
  
  mode_00 = (openmode)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  pfVar5 = in_RDI;
  bVar1 = is_mode_non_binary(mode_00);
  if (bVar1) {
    for (iVar4 = 0; iVar4 < in_RDI->ny; iVar4 = iVar4 + 1) {
      for (local_20 = 0; local_20 < in_RDI->nz; local_20 = local_20 + 1) {
        pfVar5 = in_RSI;
        pppcVar2 = field3d<cellb>::operator[](in_RSI,in_stack_ffffffffffffffcc);
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)in_RSI,(*pppcVar2)[iVar4][local_20].by);
        std::operator<<(poVar3,"\n");
        in_RSI = pfVar5;
      }
    }
  }
  else {
    bVar1 = is_mode_binary(mode_00);
    if (bVar1) {
      write_binary_yzplane<cellb>
                (unaff_retaddr,pfVar5,(_func_double_field3d<cellb>_ptr_int_int_int *)in_RSI,in_EDX,
                 in_ECX,in_stack_ffffffffffffffe4);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"fout_by_yzplane: ERROR: wrong mode");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void spatial_region::fout_by_yzplane(ofstream* pfout, int i, ios_base::openmode
        mode)
{
    if (is_mode_non_binary(mode)) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].by<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary_yzplane<cellb>(pfout, cb, getby, i, ny, nz);
    } else {
        cerr << "fout_by_yzplane: ERROR: wrong mode" << endl;
    }
}